

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datahashtable.h
# Opt level: O0

void __thiscall
soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::DataHashTable
          (DataHashTable<soplex::NameSet::Name,_soplex::DataKey> *this,_func_int_Name_ptr *hashfun,
          int maxsize,int hashsize,Real factor)

{
  int in_ECX;
  _func_int_Name_ptr *in_RSI;
  DataHashTable<soplex::NameSet::Name,_soplex::DataKey> *in_RDI;
  DataHashTable<soplex::NameSet::Name,_soplex::DataKey> *in_XMM0_Qa;
  int local_2c;
  
  Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
  ::Array(&in_XMM0_Qa->m_elem,(int)((ulong)in_RDI >> 0x20));
  in_RDI->m_hashfun = in_RSI;
  in_RDI->m_memfactor = (Real)in_XMM0_Qa;
  clear(in_XMM0_Qa);
  in_RDI->primes[0] = 0x5f3;
  in_RDI->primes[1] = 0xddb;
  in_RDI->primes[2] = 0x1f4b;
  in_RDI->primes[3] = 0x452b;
  in_RDI->primes[4] = 0x9743;
  in_RDI->primes[5] = 0x14779;
  in_RDI->primes[6] = 0x2c05d;
  in_RDI->primes[7] = 0x5e369;
  in_RDI->primes[8] = 0xc88a3;
  in_RDI->primes[9] = 0x1a9621;
  in_RDI->primes[10] = 0x382a7d;
  in_RDI->primes[0xb] = 0x56e207;
  in_RDI->primes[0xc] = 0x765079;
  in_RDI->primes[0xd] = 0x964b67;
  in_RDI->primes[0xe] = 0xb6b29d;
  in_RDI->primes[0xf] = 0xd77b7d;
  in_RDI->primes[0x10] = 0x10d39b9;
  in_RDI->primes[0x11] = 0x1726399;
  in_RDI->primes[0x12] = 0x1ef30eb;
  in_RDI->primes[0x13] = 0x2faa127;
  in_RDI->primes[0x14] = 0x40b953f;
  in_RDI->primes[0x15] = 0x520af59;
  in_RDI->primes[0x16] = 0x638f225;
  in_RDI->primes[0x17] = 0x75410bf;
  in_RDI->primes[0x18] = 0x8716bfb;
  in_RDI->primes[0x19] = 0x990bf9f;
  in_RDI->primes[0x1a] = 0xab1cda1;
  in_RDI->primes[0x1b] = 0xbd4bcb5;
  in_RDI->primes[0x1c] = 0xcf90079;
  in_RDI->primes[0x1d] = 0xf455999;
  in_RDI->primes[0x1e] = 0x12c08515;
  in_RDI->primes[0x1f] = 0x16447fab;
  in_RDI->primes[0x20] = 0x19cf6cdf;
  in_RDI->primes[0x21] = 0x1d60b42f;
  in_RDI->primes[0x22] = 0x20f7b75b;
  in_RDI->primes[0x23] = 0x24939395;
  in_RDI->primes[0x24] = 0x296a882d;
  in_RDI->primes[0x25] = 0x2d10a387;
  in_RDI->primes[0x26] = 0x30ba1ff3;
  in_RDI->primes[0x27] = 0x346762db;
  in_RDI->primes[0x28] = 0x3817cd4d;
  in_RDI->primes[0x29] = 0x3a8f05c5;
  in_RDI->primes[0x2a] = 0x7fffffff;
  in_RDI->nprimes = 0x2b;
  local_2c = in_ECX;
  if (in_ECX < 1) {
    local_2c = autoHashSize(in_RDI);
  }
  in_RDI->m_hashsize = local_2c;
  return;
}

Assistant:

explicit DataHashTable(
      int (*hashfun)(const HashItem*),
      int maxsize  = 265,
      int hashsize = 0,
      Real factor  = 2.0)
      : m_elem(maxsize)
      , m_hashfun(hashfun)
      , m_memfactor(factor)
   {
      clear();

      primes[0] = 1523;
      primes[1] = 3547;
      primes[2] = 8011;
      primes[3] = 17707;
      primes[4] = 38723;
      primes[5] = 83833;
      primes[6] = 180317;
      primes[7] = 385897;
      primes[8] = 821411;
      primes[9] = 1742369;
      primes[10] = 3680893;
      primes[11] = 5693959;
      primes[12] = 7753849;
      primes[13] = 9849703;
      primes[14] = 11973277;
      primes[15] = 14121853;
      primes[16] = 17643961;
      primes[17] = 24273817;
      primes[18] = 32452843;
      primes[19] = 49979687;
      primes[20] = 67867967;
      primes[21] = 86028121;
      primes[22] = 104395301;
      primes[23] = 122949823;
      primes[24] = 141650939;
      primes[25] = 160481183;
      primes[26] = 179424673;
      primes[27] = 198491317;
      primes[28] = 217645177;
      primes[29] = 256203161;
      primes[30] = 314606869;
      primes[31] = 373587883;
      primes[32] = 433024223;
      primes[33] = 492876847;
      primes[34] = 553105243;
      primes[35] = 613651349;
      primes[36] = 694847533;
      primes[37] = 756065159;
      primes[38] = 817504243;
      primes[39] = 879190747;
      primes[40] = 941083981;
      primes[41] = 982451653;
      primes[42] = INT_MAX;
      nprimes = 43;

      m_hashsize = (hashsize < 1) ? autoHashSize() : hashsize;

      assert(m_memfactor > 1.0);
      assert(isConsistent());
   }